

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::MemberSyntax> *args_4;
  GenerateBlockSyntax *pGVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor_1;
  NamedBlockClauseSyntax *local_40;
  DeepCloneVisitor visitor;
  NamedLabelSyntax *local_28;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x50) == (SyntaxNode *)0x0) {
    local_28 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_28 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x50),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_40 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_40 = (NamedBlockClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x68),&visitor_1,(BumpAllocator *)__child_stack);
  }
  args_4 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0x70),
                      (BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xb8) == (SyntaxNode *)0x0) {
    _visitor_2 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_2 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0xb8),&visitor_2,(BumpAllocator *)__child_stack)
    ;
  }
  pGVar1 = BumpAllocator::
           emplace<slang::syntax::GenerateBlockSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::NamedLabelSyntax*,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_28,(Token *)&visitor,&local_40,
                      args_4,(Token *)&visitor_1,(NamedBlockClauseSyntax **)&visitor_2);
  return (int)pGVar1;
}

Assistant:

static SyntaxNode* clone(const GenerateBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<GenerateBlockSyntax>(
        *deepClone(node.attributes, alloc),
        node.label ? deepClone(*node.label, alloc) : nullptr,
        node.begin.deepClone(alloc),
        node.beginName ? deepClone(*node.beginName, alloc) : nullptr,
        *deepClone(node.members, alloc),
        node.end.deepClone(alloc),
        node.endName ? deepClone(*node.endName, alloc) : nullptr
    );
}